

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.cpp
# Opt level: O3

bool __thiscall Kernel::TopLevelVarLikeTermIterator::hasNext(TopLevelVarLikeTermIterator *this)

{
  Term ***pppTVar1;
  TermList TVar2;
  int iVar3;
  Term **ppTVar4;
  uint uVar5;
  Term *pTVar6;
  TermList TVar7;
  bool bVar8;
  Term *term;
  bool bVar9;
  TermList head;
  TermList tl;
  TermList local_40;
  TermList local_38;
  
  if (hasNext()::args == '\0') {
    hasNext();
  }
  local_40._content = 2;
  bVar8 = true;
  if (this->_next == (Term *)0x0) {
    do {
      ppTVar4 = (this->_stack)._cursor;
      bVar9 = ppTVar4 == (this->_stack)._stack;
      bVar8 = !bVar9;
      if (bVar9) {
        return false;
      }
      (this->_stack)._cursor = ppTVar4 + -1;
      term = ppTVar4[-1];
      ApplicativeHelper::getHeadAndArgs(term,&local_40,&hasNext::args);
      if (((local_40._content & 1) == 0) || (hasNext::args._cursor == hasNext::args._stack)) {
        bVar9 = ApplicativeHelper::isComb(local_40);
        if ((bVar9) &&
           (bVar9 = ApplicativeHelper::isUnderApplied
                              (local_40,(uint)((ulong)((long)hasNext::args._cursor -
                                                      (long)hasNext::args._stack) >> 3)), !bVar9)) {
          iVar3 = 0;
          pTVar6 = term;
          if (*(int *)&term->field_0xc < 0) {
            iVar3 = 0;
            do {
              pTVar6 = *(Term **)&(pTVar6->field_9)._vars;
              if (((ulong)pTVar6 & 1) != 0) {
                uVar5 = 3;
                goto LAB_005c3d0c;
              }
              iVar3 = iVar3 + 2;
            } while (*(int *)&pTVar6->field_0xc < 0);
          }
          uVar5 = (pTVar6->field_9)._vars;
LAB_005c3d0c:
          if (iVar3 + uVar5 != 0) goto LAB_005c3da0;
        }
        while (hasNext::args._cursor != hasNext::args._stack) {
          local_38._content = hasNext::args._cursor[-1]._content;
          hasNext::args._cursor = hasNext::args._cursor + -1;
          bVar9 = TermList::isApplication(&local_38);
          TVar2._content = local_38._content;
          if (bVar9) {
            iVar3 = 0;
            TVar7._content = local_38._content;
            if (*(int *)(local_38._content + 0xc) < 0) {
              iVar3 = 0;
              do {
                TVar7._content = *(uint64_t *)&(((Term *)TVar7._content)->field_9)._vars;
                if ((TVar7._content & 1) != 0) {
                  uVar5 = 3;
                  goto LAB_005c3d6f;
                }
                iVar3 = iVar3 + 2;
              } while (*(int *)&((Term *)TVar7._content)->field_0xc < 0);
            }
            uVar5 = (((Term *)TVar7._content)->field_9)._vars;
LAB_005c3d6f:
            if (iVar3 + uVar5 != 0) {
              ppTVar4 = (this->_stack)._cursor;
              if (ppTVar4 == (this->_stack)._end) {
                Lib::Stack<Kernel::Term_*>::expand(&this->_stack);
                ppTVar4 = (this->_stack)._cursor;
              }
              *ppTVar4 = (Term *)TVar2._content;
              pppTVar1 = &(this->_stack)._cursor;
              *pppTVar1 = *pppTVar1 + 1;
            }
          }
        }
        term = this->_next;
      }
      else {
LAB_005c3da0:
        this->_next = term;
      }
    } while (term == (Term *)0x0);
  }
  return bVar8;
}

Assistant:

bool TopLevelVarLikeTermIterator::hasNext()
{
  static TermStack args;
  TermList head;
  
  if(_next){ return true; }
  while(!_stack.isEmpty()){
    Term* t = _stack.pop();
    ASS(t->isApplication());
    AH::getHeadAndArgs(t, head, args);
    ASS(args.size());
    if(head.isVar() && args.size()){
      _next = t;
    } else if(AH::isComb(head) && !AH::isUnderApplied(head, args.size()) && !t->ground()){
      _next = t;
    } else {
      while(!args.isEmpty()){
        TermList tl = args.pop();
        if(tl.isApplication() && !tl.term()->ground()){
          _stack.push(tl.term());
        }
      }
    }
    if(_next) { return true; }
  }
  return false;  
}